

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtreeview.cpp
# Opt level: O0

void __thiscall
QTreeViewPrivate::prepareAnimatedOperation(QTreeViewPrivate *this,int item,Direction direction)

{
  int iVar1;
  int iVar2;
  int iVar3;
  const_reference pQVar4;
  QVariant *pQVar5;
  QPixmap *other;
  int in_EDX;
  int in_ESI;
  long in_RDI;
  long in_FS_OFFSET;
  int i;
  int c;
  int h;
  int limit;
  int top;
  QRect rect;
  undefined4 in_stack_ffffffffffffff28;
  int in_stack_ffffffffffffff2c;
  QRect *in_stack_ffffffffffffff30;
  QPixmap *this_00;
  undefined8 in_stack_ffffffffffffff40;
  QPixmap *this_01;
  QTreeViewPrivate *in_stack_ffffffffffffff48;
  undefined4 in_stack_ffffffffffffff68;
  undefined4 in_stack_ffffffffffffff6c;
  int in_stack_ffffffffffffff70;
  int in_stack_ffffffffffffff74;
  int in_stack_ffffffffffffff78;
  QPixmap local_70 [24];
  undefined1 local_58 [16];
  QPixmap local_48 [32];
  QVariant local_28;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  *(int *)(in_RDI + 0x550) = in_ESI;
  *(undefined8 *)(in_RDI + 0x588) = *(undefined8 *)(in_RDI + 0x2b0);
  QAbstractAnimation::setDirection((int)in_RDI + 0x540);
  iVar1 = coordinateForItem((QTreeViewPrivate *)
                            CONCAT44(in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68),
                            (int)((ulong)in_RDI >> 0x20));
  iVar2 = itemHeight(in_stack_ffffffffffffff48,(int)((ulong)in_stack_ffffffffffffff40 >> 0x20));
  iVar1 = iVar1 + iVar2;
  local_58._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
  local_58._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
  local_58 = (undefined1  [16])QWidget::rect((QWidget *)in_stack_ffffffffffffff48);
  QRect::setTop(in_stack_ffffffffffffff30,in_stack_ffffffffffffff2c);
  if (in_EDX == 1) {
    in_stack_ffffffffffffff78 =
         QRect::height((QRect *)CONCAT44(in_stack_ffffffffffffff2c,in_stack_ffffffffffffff28));
    in_stack_ffffffffffffff78 = in_stack_ffffffffffffff78 << 1;
    in_stack_ffffffffffffff74 = 0;
    pQVar4 = QList<QTreeViewItem>::at
                       ((QList<QTreeViewItem> *)in_stack_ffffffffffffff30,
                        CONCAT44(in_stack_ffffffffffffff2c,in_stack_ffffffffffffff28));
    in_stack_ffffffffffffff70 =
         in_ESI + ((uint)(*(ulong *)&pQVar4->field_0x1c >> 4) & 0xfffffff) + 1;
    for (iVar2 = in_ESI + 1;
        iVar2 < in_stack_ffffffffffffff70 && in_stack_ffffffffffffff74 < in_stack_ffffffffffffff78;
        iVar2 = iVar2 + 1) {
      iVar3 = itemHeight(in_stack_ffffffffffffff48,(int)((ulong)in_stack_ffffffffffffff40 >> 0x20));
      in_stack_ffffffffffffff74 = iVar3 + in_stack_ffffffffffffff74;
    }
    QRect::setHeight(in_stack_ffffffffffffff30,in_stack_ffffffffffffff2c);
    pQVar5 = (QVariant *)(in_RDI + 0x540);
    ::QVariant::QVariant(&local_28,iVar1 + in_stack_ffffffffffffff74);
    QVariantAnimation::setEndValue(pQVar5);
    ::QVariant::~QVariant(&local_28);
  }
  other = (QPixmap *)(in_RDI + 0x540);
  this_00 = local_48;
  ::QVariant::QVariant((QVariant *)this_00,iVar1);
  QVariantAnimation::setStartValue((QVariant *)other);
  ::QVariant::~QVariant((QVariant *)this_00);
  this_01 = local_70;
  renderTreeToPixmapForAnimation
            ((QTreeViewPrivate *)CONCAT44(iVar1,in_stack_ffffffffffffff78),
             (QRect *)CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70));
  QPixmap::operator=(this_00,other);
  QPixmap::~QPixmap(this_01);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QTreeViewPrivate::prepareAnimatedOperation(int item, QVariantAnimation::Direction direction)
{
    animatedOperation.item = item;
    animatedOperation.viewport = viewport;
    animatedOperation.setDirection(direction);

    int top = coordinateForItem(item) + itemHeight(item);
    QRect rect = viewport->rect();
    rect.setTop(top);
    if (direction == QVariantAnimation::Backward) {
        const int limit = rect.height() * 2;
        int h = 0;
        int c = item + viewItems.at(item).total + 1;
        for (int i = item + 1; i < c && h < limit; ++i)
            h += itemHeight(i);
        rect.setHeight(h);
        animatedOperation.setEndValue(top + h);
    }
    animatedOperation.setStartValue(top);
    animatedOperation.before = renderTreeToPixmapForAnimation(rect);
}